

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O3

Vec_Int_t * Abc_SclFindMinAreas(SC_Lib *pLib,int fUseMax)

{
  long *plVar1;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  float fVar5;
  void *pvVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  float fVar14;
  
  iVar2 = (pLib->vCells).nSize;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  pVVar8->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar8->pArray = (int *)0x0;
    pVVar8->nSize = iVar2;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
    pVVar8->pArray = __s;
    pVVar8->nSize = iVar2;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar2 << 2);
      goto LAB_00450a37;
    }
  }
  __s = (int *)0x0;
LAB_00450a37:
  uVar9 = (ulong)(pLib->vCellClasses).nSize;
  if (0 < (long)uVar9) {
    ppvVar3 = (pLib->vCellClasses).pArray;
    uVar10 = 0;
    do {
      pvVar4 = ppvVar3[uVar10];
      pvVar13 = pvVar4;
      pvVar11 = pvVar4;
      if (fUseMax != 0) {
        fVar14 = *(float *)((long)pvVar4 + 0x18);
        pvVar12 = pvVar4;
        do {
          fVar5 = *(float *)((long)pvVar12 + 0x18);
          pvVar6 = pvVar12;
          if (*(float *)((long)pvVar12 + 0x18) <= fVar14) {
            fVar5 = fVar14;
            pvVar6 = pvVar11;
          }
          pvVar11 = pvVar6;
          fVar14 = fVar5;
          pvVar12 = *(void **)((long)pvVar12 + 0x48);
        } while (pvVar12 != pvVar4);
      }
      do {
        iVar7 = *(int *)((long)pvVar13 + 8);
        if (((long)iVar7 < 0) || (iVar2 <= iVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[iVar7] = *(int *)((long)pvVar11 + 8);
        plVar1 = (long *)((long)pvVar13 + 0x48);
        pvVar13 = (void *)*plVar1;
      } while ((void *)*plVar1 != pvVar4);
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar9);
  }
  return pVVar8;
}

Assistant:

Vec_Int_t * Abc_SclFindMinAreas( SC_Lib * pLib, int fUseMax )
{
    Vec_Int_t * vMinCells;
    SC_Cell * pCell, * pRepr = NULL, * pBest = NULL;
    int i, k;
    // map each gate in the library into its min/max-size prototype
    vMinCells = Vec_IntStartFull( Vec_PtrSize(&pLib->vCells) );
    SC_LibForEachCellClass( pLib, pRepr, i )
    {
        pBest = fUseMax ? Abc_SclFindMaxAreaCell(pRepr) : pRepr;
        SC_RingForEachCell( pRepr, pCell, k )
            Vec_IntWriteEntry( vMinCells, pCell->Id, pBest->Id );
    }
    return vMinCells;
}